

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommonCore.cpp
# Opt level: O0

void __thiscall helics::CommonCore::checkForNamedInterface(CommonCore *this,ActionMessage *command)

{
  string_view name_00;
  string_view name_01;
  string_view string2;
  string_view string2_00;
  GlobalHandle fed_id;
  string_view string1;
  string_view string1_00;
  string_view name_02;
  string_view name_03;
  string_view name_04;
  string_view name_05;
  string_view str;
  bool bVar1;
  action_t aVar2;
  BasicHandleInfo *pBVar3;
  ActionMessage *in_RSI;
  BasicHandleInfo *ept;
  BasicHandleInfo *filt;
  BasicHandleInfo *pub_1;
  BasicHandleInfo *inp;
  string inputName;
  type name;
  BasicHandleInfo *pub;
  undefined6 in_stack_fffffffffffffda8;
  undefined6 uVar4;
  InterfaceFlags in_stack_fffffffffffffdae;
  undefined2 uVar5;
  ActionMessage *in_stack_fffffffffffffdb0;
  size_t in_stack_fffffffffffffdb8;
  HandleManager *in_stack_fffffffffffffdc0;
  GlobalFederateId in_stack_fffffffffffffdc8;
  InterfaceHandle in_stack_fffffffffffffdcc;
  HandleManager *in_stack_fffffffffffffdd0;
  ActionMessage *pAVar6;
  size_t in_stack_fffffffffffffdd8;
  SmallBuffer *in_stack_fffffffffffffde0;
  SmallBuffer *in_stack_fffffffffffffde8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffdf0;
  ActionMessage *local_150;
  CommonCore *in_stack_fffffffffffffec0;
  allocator<char> local_f1;
  string_view local_f0;
  __sv_type local_c0;
  __sv_type local_b0;
  ActionMessage *in_stack_ffffffffffffff68;
  CommonCore *in_stack_ffffffffffffff70;
  
  aVar2 = ActionMessage::action(in_RSI);
  switch(aVar2) {
  case cmd_add_named_input:
    local_f0 = ActionMessage::name((ActionMessage *)0x56a8fa);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
              (in_stack_fffffffffffffdf0,
               (basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffde8,
               (allocator<char> *)in_stack_fffffffffffffde0);
    std::allocator<char>::~allocator(&local_f1);
    std::__cxx11::string::operator_cast_to_basic_string_view
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffdb0);
    name_03._M_str = (char *)in_stack_fffffffffffffde0;
    name_03._M_len = in_stack_fffffffffffffdd8;
    pBVar3 = HandleManager::getInterfaceHandle
                       (in_stack_fffffffffffffdd0,name_03,
                        (InterfaceType)((uint)in_stack_fffffffffffffdcc.hid >> 0x18));
    if (pBVar3 == (BasicHandleInfo *)0x0) {
      routeMessage(in_stack_fffffffffffffec0,local_150);
    }
    else {
      bVar1 = checkActionFlag<helics::BasicHandleInfo,helics::ConnectionFlags>
                        ((unique_ptr<helics::BrokerObject,_std::default_delete<helics::BrokerObject>_>
                          *)pBVar3,disconnected_flag);
      if (!bVar1) {
        ActionMessage::setAction(in_RSI,cmd_add_publisher);
        ActionMessage::setDestination(in_RSI,pBVar3->handle);
        SmallBuffer::clear(&in_RSI->payload);
        ActionMessage::getStringData_abi_cxx11_(in_RSI);
        bVar1 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)in_stack_fffffffffffffdc0);
        if (bVar1) {
          ActionMessage::getSource
                    ((ActionMessage *)CONCAT26(in_stack_fffffffffffffdae,in_stack_fffffffffffffda8))
          ;
          fed_id.handle.hid = in_stack_fffffffffffffdcc.hid;
          fed_id.fed_id.gid = in_stack_fffffffffffffdc8.gid;
          pBVar3 = HandleManager::findHandle(in_stack_fffffffffffffdc0,fed_id);
          if (pBVar3 != (BasicHandleInfo *)0x0) {
            pAVar6 = in_RSI;
            std::__cxx11::string::operator_cast_to_basic_string_view
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_fffffffffffffdb0);
            std::__cxx11::string::operator_cast_to_basic_string_view
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_fffffffffffffdb0);
            string1_00._M_len._4_4_ = in_stack_fffffffffffffdcc.hid;
            string1_00._M_len._0_4_ = in_stack_fffffffffffffdc8.gid;
            string1_00._M_str = (char *)pAVar6;
            string2_00._M_str = (char *)in_stack_fffffffffffffdc0;
            string2_00._M_len = in_stack_fffffffffffffdb8;
            ActionMessage::setStringData(in_stack_fffffffffffffdb0,string1_00,string2_00);
          }
        }
        addTargetToInterface(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
        ActionMessage::setAction(in_RSI,cmd_add_subscriber);
        ActionMessage::swapSourceDest(in_stack_fffffffffffffdb0);
        ActionMessage::clearStringData((ActionMessage *)0x56abd6);
        std::__cxx11::string::operator_cast_to_basic_string_view
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffdb0);
        name_00._M_len._6_2_ = in_stack_fffffffffffffdae;
        name_00._M_len._0_6_ = in_stack_fffffffffffffda8;
        name_00._M_str = (char *)in_stack_fffffffffffffdb0;
        ActionMessage::name((ActionMessage *)0x56ac1c,name_00);
        addTargetToInterface(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
      }
    }
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffdb0);
    break;
  case cmd_add_named_filter:
    ActionMessage::name((ActionMessage *)0x56ac9f);
    name_04._M_str = (char *)in_stack_fffffffffffffde0;
    name_04._M_len = in_stack_fffffffffffffdd8;
    pBVar3 = HandleManager::getInterfaceHandle
                       (in_stack_fffffffffffffdd0,name_04,
                        (InterfaceType)((uint)in_stack_fffffffffffffdcc.hid >> 0x18));
    if (pBVar3 == (BasicHandleInfo *)0x0) {
      routeMessage(in_stack_fffffffffffffec0,local_150);
    }
    else {
      bVar1 = checkActionFlag<helics::BasicHandleInfo,helics::ConnectionFlags>
                        ((unique_ptr<helics::BrokerObject,_std::default_delete<helics::BrokerObject>_>
                          *)pBVar3,disconnected_flag);
      if (!bVar1) {
        ActionMessage::setAction(in_RSI,cmd_add_endpoint);
        ActionMessage::setDestination(in_RSI,pBVar3->handle);
        SmallBuffer::clear(&in_RSI->payload);
        addTargetToInterface(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
        ActionMessage::setAction(in_RSI,cmd_add_filter);
        ActionMessage::swapSourceDest(in_stack_fffffffffffffdb0);
        bVar1 = checkActionFlag<helics::BasicHandleInfo,helics::FilterFlags>
                          ((unique_ptr<helics::BrokerObject,_std::default_delete<helics::BrokerObject>_>
                            *)pBVar3,clone_flag);
        if (bVar1) {
          setActionFlag<helics::ActionMessage,helics::FilterFlags>(in_RSI,clone_flag);
        }
        addTargetToInterface(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
      }
    }
    break;
  case cmd_add_named_publication:
    ActionMessage::name((ActionMessage *)0x56a6f2);
    name_02._M_str = (char *)in_stack_fffffffffffffde0;
    name_02._M_len = in_stack_fffffffffffffdd8;
    pBVar3 = HandleManager::getInterfaceHandle
                       (in_stack_fffffffffffffdd0,name_02,
                        (InterfaceType)((uint)in_stack_fffffffffffffdcc.hid >> 0x18));
    if (pBVar3 == (BasicHandleInfo *)0x0) {
      routeMessage(in_stack_fffffffffffffec0,local_150);
    }
    else {
      bVar1 = checkActionFlag<helics::BasicHandleInfo,helics::ConnectionFlags>
                        ((unique_ptr<helics::BrokerObject,_std::default_delete<helics::BrokerObject>_>
                          *)pBVar3,disconnected_flag);
      if (!bVar1) {
        ActionMessage::setAction(in_RSI,cmd_add_subscriber);
        ActionMessage::setDestination(in_RSI,pBVar3->handle);
        SmallBuffer::SmallBuffer
                  ((SmallBuffer *)in_stack_fffffffffffffdb0,
                   (SmallBuffer *)CONCAT26(in_stack_fffffffffffffdae,in_stack_fffffffffffffda8));
        SmallBuffer::clear(&in_RSI->payload);
        addTargetToInterface(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
        ActionMessage::setAction(in_RSI,cmd_add_publisher);
        SmallBuffer::operator=(in_stack_fffffffffffffde8,in_stack_fffffffffffffde0);
        ActionMessage::swapSourceDest(in_stack_fffffffffffffdb0);
        local_b0 = std::__cxx11::string::operator_cast_to_basic_string_view
                             ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              in_stack_fffffffffffffdb0);
        local_c0 = std::__cxx11::string::operator_cast_to_basic_string_view
                             ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              in_stack_fffffffffffffdb0);
        string1._M_len._4_4_ = in_stack_fffffffffffffdcc.hid;
        string1._M_len._0_4_ = in_stack_fffffffffffffdc8.gid;
        string1._M_str = (char *)in_stack_fffffffffffffdd0;
        string2._M_str = (char *)in_stack_fffffffffffffdc0;
        string2._M_len = in_stack_fffffffffffffdb8;
        ActionMessage::setStringData(in_stack_fffffffffffffdb0,string1,string2);
        addTargetToInterface(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
        SmallBuffer::~SmallBuffer((SmallBuffer *)in_stack_fffffffffffffdb0);
      }
    }
    break;
  case cmd_add_named_endpoint:
    ActionMessage::name((ActionMessage *)0x56adfc);
    name_05._M_str = (char *)in_stack_fffffffffffffde0;
    name_05._M_len = in_stack_fffffffffffffdd8;
    pBVar3 = HandleManager::getInterfaceHandle
                       (in_stack_fffffffffffffdd0,name_05,
                        (InterfaceType)((uint)in_stack_fffffffffffffdcc.hid >> 0x18));
    if (pBVar3 == (BasicHandleInfo *)0x0) {
      routeMessage(in_stack_fffffffffffffec0,local_150);
    }
    else {
      bVar1 = checkActionFlag<helics::BasicHandleInfo,helics::ConnectionFlags>
                        ((unique_ptr<helics::BrokerObject,_std::default_delete<helics::BrokerObject>_>
                          *)pBVar3,disconnected_flag);
      if (!bVar1) {
        if (in_RSI->counter == 0x66) {
          ActionMessage::setAction(in_RSI,cmd_add_filter);
        }
        else {
          ActionMessage::setAction(in_RSI,cmd_add_endpoint);
          toggleActionFlag<helics::ActionMessage,helics::InterfaceFlags>
                    (in_stack_fffffffffffffdb0,in_stack_fffffffffffffdae);
        }
        ActionMessage::setDestination(in_RSI,pBVar3->handle);
        addTargetToInterface(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
        ActionMessage::setAction(in_RSI,cmd_add_endpoint);
        if (in_RSI->counter == 0x65) {
          toggleActionFlag<helics::ActionMessage,helics::InterfaceFlags>
                    (in_stack_fffffffffffffdb0,in_stack_fffffffffffffdae);
        }
        ActionMessage::swapSourceDest(in_stack_fffffffffffffdb0);
        ActionMessage::setSource(in_RSI,pBVar3->handle);
        uVar4 = SUB86(in_RSI,0);
        uVar5 = (undefined2)((ulong)in_RSI >> 0x30);
        std::__cxx11::string::operator_cast_to_basic_string_view
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffdb0);
        name_01._M_len._6_2_ = uVar5;
        name_01._M_len._0_6_ = uVar4;
        name_01._M_str = (char *)in_stack_fffffffffffffdb0;
        ActionMessage::name((ActionMessage *)0x56af95,name_01);
        std::__cxx11::string::operator_cast_to_basic_string_view
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RSI);
        str._M_str = (char *)in_stack_fffffffffffffde0;
        str._M_len = in_stack_fffffffffffffdd8;
        ActionMessage::setString
                  ((ActionMessage *)in_stack_fffffffffffffdd0,in_stack_fffffffffffffdcc.hid,str);
        addTargetToInterface(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
      }
    }
  }
  return;
}

Assistant:

void CommonCore::checkForNamedInterface(ActionMessage& command)
{
    switch (command.action()) {
        case CMD_ADD_NAMED_PUBLICATION: {
            auto* pub = loopHandles.getInterfaceHandle(command.name(), InterfaceType::PUBLICATION);
            if (pub != nullptr) {
                if (checkActionFlag(*pub, disconnected_flag)) {
                    // TODO(PT): this might generate an error if the required flag was set
                    return;
                }
                command.setAction(CMD_ADD_SUBSCRIBER);
                command.setDestination(pub->handle);
                auto name{std::move(command.payload)};
                command.payload.clear();

                addTargetToInterface(command);
                command.setAction(CMD_ADD_PUBLISHER);
                command.payload = std::move(name);
                command.swapSourceDest();
                command.setStringData(pub->type, pub->units);
                addTargetToInterface(command);
            } else {
                routeMessage(std::move(command));
            }
        } break;
        case CMD_ADD_NAMED_INPUT: {
            const std::string inputName(command.name());  // need to copy the name
            auto* inp = loopHandles.getInterfaceHandle(inputName, InterfaceType::INPUT);
            if (inp != nullptr) {
                if (checkActionFlag(*inp, disconnected_flag)) {
                    // TODO(PT): this might generate an error if the required flag was set
                    return;
                }
                command.setAction(CMD_ADD_PUBLISHER);
                command.setDestination(inp->handle);
                command.payload.clear();
                if (command.getStringData().empty()) {
                    auto* pub = loopHandles.findHandle(command.getSource());
                    if (pub != nullptr) {
                        command.setStringData(pub->type, pub->units);
                    }
                }
                addTargetToInterface(command);
                command.setAction(CMD_ADD_SUBSCRIBER);
                command.swapSourceDest();
                command.clearStringData();
                command.name(inputName);
                addTargetToInterface(command);
            } else {
                routeMessage(std::move(command));
            }
        } break;
        case CMD_ADD_NAMED_FILTER: {
            auto* filt = loopHandles.getInterfaceHandle(command.name(), InterfaceType::FILTER);
            if (filt != nullptr) {
                if (checkActionFlag(*filt, disconnected_flag)) {
                    // TODO(PT): this might generate an error if the required flag was set
                    return;
                }
                command.setAction(CMD_ADD_ENDPOINT);
                command.setDestination(filt->handle);
                command.payload.clear();
                addTargetToInterface(command);
                command.setAction(CMD_ADD_FILTER);
                command.swapSourceDest();
                if (checkActionFlag(*filt, clone_flag)) {
                    setActionFlag(command, clone_flag);
                }
                addTargetToInterface(command);
            } else {
                routeMessage(std::move(command));
            }
        } break;
        case CMD_ADD_NAMED_ENDPOINT: {
            auto* ept = loopHandles.getInterfaceHandle(command.name(), InterfaceType::ENDPOINT);
            if (ept != nullptr) {
                if (checkActionFlag(*ept, disconnected_flag)) {
                    // TODO(PT): this might generate an error if the required flag was set
                    return;
                }

                if (command.counter != static_cast<uint16_t>(InterfaceType::FILTER)) {
                    command.setAction(CMD_ADD_ENDPOINT);
                    toggleActionFlag(command, destination_target);
                } else {
                    command.setAction(CMD_ADD_FILTER);
                }
                command.setDestination(ept->handle);
                addTargetToInterface(command);

                // to the originating interface
                command.setAction(CMD_ADD_ENDPOINT);
                if (command.counter == static_cast<uint16_t>(InterfaceType::ENDPOINT)) {
                    toggleActionFlag(command, destination_target);
                }

                command.swapSourceDest();
                command.setSource(ept->handle);
                command.name(ept->key);
                command.setString(typeStringLoc, ept->type);
                addTargetToInterface(command);

            } else {
                routeMessage(std::move(command));
            }
        } break;
        default:
            break;
    }
}